

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

TypeInfo * dap::TypeOf<std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>_>::type(void)

{
  int iVar1;
  long *plVar2;
  BasicTypeInfo<std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>_> *pBVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::type()::typeinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::
                                 type()::typeinfo);
    if (iVar1 != 0) {
      TypeOf<dap::Checksum>::type();
      (*TypeOf<dap::Checksum>::type::typeinfo.super_BasicTypeInfo<dap::Checksum>.super_TypeInfo.
        _vptr_TypeInfo[2])(&local_50,&TypeOf<dap::Checksum>::type::typeinfo);
      std::operator+(&local_30,"array<",&local_50);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70.field_2._8_8_ = plVar2[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_70._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      pBVar3 = TypeInfo::
               create<dap::BasicTypeInfo<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>,std::__cxx11::string>
                         (&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      type::typeinfo = pBVar3;
      __cxa_guard_release(&TypeOf<std::vector<dap::Checksum,std::allocator<dap::Checksum>>>::type()
                           ::typeinfo);
    }
  }
  return &type::typeinfo->super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo = TypeInfo::create<BasicTypeInfo<array<T>>>(
        "array<" + TypeOf<T>::type()->name() + ">");
    return typeinfo;
  }